

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void save_npc(DisasContext_conflict8 *dc)

{
  TCGArg a2;
  TCGContext_conflict8 *tcg_ctx_00;
  TCGv_i64 v1;
  TCGv_i64 v2;
  TCGv_i64 c2;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGContext_conflict8 *tcg_ctx;
  uintptr_t o;
  
  a2 = dc->npc;
  if (a2 != 1) {
    tcg_ctx_00 = dc->uc->tcg_ctx;
    if (a2 != 2) {
      tcg_gen_op2_sparc64(tcg_ctx_00,INDEX_op_movi_i64,
                          (TCGArg)(tcg_ctx_00->cpu_npc + (long)tcg_ctx_00),a2);
      return;
    }
    v1 = tcg_const_i64_sparc64(tcg_ctx_00,dc->jump_pc[0]);
    v2 = tcg_const_i64_sparc64(tcg_ctx_00,dc->jump_pc[1]);
    c2 = tcg_const_i64_sparc64(tcg_ctx_00,0);
    tcg_gen_movcond_i64_sparc64
              (tcg_ctx_00,TCG_COND_NE,tcg_ctx_00->cpu_npc,tcg_ctx_00->cpu_cond,c2,v1,v2);
    tcg_temp_free_internal_sparc64(tcg_ctx_00,(TCGTemp *)(v1 + (long)tcg_ctx_00));
    tcg_temp_free_internal_sparc64(tcg_ctx_00,(TCGTemp *)(v2 + (long)tcg_ctx_00));
    tcg_temp_free_internal_sparc64(tcg_ctx_00,(TCGTemp *)(c2 + (long)tcg_ctx_00));
    dc->npc = 1;
  }
  return;
}

Assistant:

static inline void save_npc(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (dc->npc == JUMP_PC) {
        gen_generic_branch(dc);
        dc->npc = DYNAMIC_PC;
    } else if (dc->npc != DYNAMIC_PC) {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_npc, dc->npc);
    }
}